

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

bool __thiscall
basist::basisu_transcoder::get_image_level_info
          (basisu_transcoder *this,void *pData,uint32_t data_size,
          basisu_image_level_info *image_info,uint32_t image_index,uint32_t level_index)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32_t data_size_00;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  bVar2 = validate_header_quick(this,pData,data_size);
  if ((!bVar2) ||
     (uVar3 = find_first_slice_index(this,pData,data_size_00,image_index,level_index),
     (int)uVar3 < 0)) {
    return false;
  }
  uVar4 = (uint)*(byte *)((long)pData + 0x11) |
          (uint)*(byte *)((long)pData + 0x12) << 8 | (uint)*(byte *)((long)pData + 0x13) << 0x10;
  if (uVar4 <= image_index) {
    return image_index < uVar4;
  }
  uVar4 = *(uint *)((long)pData + 0x41);
  lVar1 = (ulong)uVar3 * 0x17 + (ulong)uVar4;
  image_info->m_image_index = image_index;
  image_info->m_level_index = level_index;
  if (*(char *)((long)pData + 0x14) == '\0') {
    bVar5 = *(byte *)((long)pData + 0x15) >> 2;
  }
  else {
    bVar5 = *(byte *)((long)pData + lVar1 + 4);
  }
  image_info->m_alpha_flag = (bool)(bVar5 & 1);
  image_info->m_iframe_flag = (bool)(*(byte *)((long)pData + lVar1 + 4) >> 1 & 1);
  image_info->m_width =
       (uint)*(byte *)((long)pData + lVar1 + 10) * 0x400 +
       (uint)*(byte *)((long)pData + lVar1 + 9) * 4;
  image_info->m_height =
       (uint)*(byte *)((long)pData + lVar1 + 0xc) * 0x400 +
       (uint)*(byte *)((long)pData + lVar1 + 0xb) * 4;
  image_info->m_orig_width = (uint)*(ushort *)((long)pData + lVar1 + 5);
  image_info->m_orig_height = (uint)*(ushort *)((long)pData + lVar1 + 7);
  uVar6 = (uint)*(ushort *)((long)pData + lVar1 + 9);
  image_info->m_num_blocks_x = uVar6;
  uVar7 = (uint)*(ushort *)((long)pData + lVar1 + 0xb);
  image_info->m_num_blocks_y = uVar7;
  image_info->m_total_blocks = uVar7 * uVar6;
  image_info->m_first_slice_index = uVar3;
  image_info->m_rgb_file_ofs = *(uint32_t *)((long)pData + lVar1 + 0xd);
  image_info->m_rgb_file_len = *(uint32_t *)((long)pData + lVar1 + 0x11);
  image_info->m_alpha_file_ofs = 0;
  image_info->m_alpha_file_len = 0;
  if (*(char *)((long)pData + 0x14) != '\0') {
    return true;
  }
  if ((*(byte *)((long)pData + 0x15) & 4) == 0) {
    return true;
  }
  if ((int)(uVar3 + 1) <
      (int)((uint)*(byte *)((long)pData + 0xe) |
           (uint)*(byte *)((long)pData + 0xf) << 8 | (uint)*(byte *)((long)pData + 0x10) << 0x10)) {
    lVar1 = (ulong)(uVar3 + 1) * 0x17;
    image_info->m_alpha_file_ofs = *(uint32_t *)((long)pData + lVar1 + (ulong)uVar4 + 0xd);
    image_info->m_alpha_file_len = *(uint32_t *)((long)pData + lVar1 + (ulong)uVar4 + 0x11);
    return true;
  }
  __assert_fail("(slice_index + 1) < (int)pHeader->m_total_slices",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x27cc,
                "bool basist::basisu_transcoder::get_image_level_info(const void *, uint32_t, basisu_image_level_info &, uint32_t, uint32_t) const"
               );
}

Assistant:

bool basisu_transcoder::get_image_level_info(const void* pData, uint32_t data_size, basisu_image_level_info& image_info, uint32_t image_index, uint32_t level_index) const
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_info: validate_file_checksums failed\n");
			return false;
		}

		int slice_index = find_first_slice_index(pData, data_size, image_index, level_index);
		if (slice_index < 0)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_info: failed finding slice\n");
			return false;
		}

		const basis_file_header* pHeader = static_cast<const basis_file_header*>(pData);

		if (image_index >= pHeader->m_total_images)
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::get_image_level_info: invalid image_index\n");
			return false;
		}

		const basis_slice_desc* pSlice_descs = reinterpret_cast<const basis_slice_desc*>(static_cast<const uint8_t*>(pData) + pHeader->m_slice_desc_file_ofs);

		const basis_slice_desc& slice_desc = pSlice_descs[slice_index];

		image_info.m_image_index = image_index;
		image_info.m_level_index = level_index;
		
		// For ETC1S, if anything has alpha all images have alpha. For UASTC, we only report alpha when the image actually has alpha.
		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
			image_info.m_alpha_flag = (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices) != 0;
		else
			image_info.m_alpha_flag = (slice_desc.m_flags & cSliceDescFlagsHasAlpha) != 0;
		
		image_info.m_iframe_flag = (slice_desc.m_flags & cSliceDescFlagsFrameIsIFrame) != 0;
		image_info.m_width = slice_desc.m_num_blocks_x * 4;
		image_info.m_height = slice_desc.m_num_blocks_y * 4;
		image_info.m_orig_width = slice_desc.m_orig_width;
		image_info.m_orig_height = slice_desc.m_orig_height;
		image_info.m_num_blocks_x = slice_desc.m_num_blocks_x;
		image_info.m_num_blocks_y = slice_desc.m_num_blocks_y;
		image_info.m_total_blocks = image_info.m_num_blocks_x * image_info.m_num_blocks_y;
		image_info.m_first_slice_index = slice_index;

		image_info.m_rgb_file_ofs = slice_desc.m_file_ofs;
		image_info.m_rgb_file_len = slice_desc.m_file_size;
		image_info.m_alpha_file_ofs = 0;
		image_info.m_alpha_file_len = 0;

		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (pHeader->m_flags & cBASISHeaderFlagHasAlphaSlices)
			{
				assert((slice_index + 1) < (int)pHeader->m_total_slices);
				image_info.m_alpha_file_ofs = pSlice_descs[slice_index + 1].m_file_ofs;
				image_info.m_alpha_file_len = pSlice_descs[slice_index + 1].m_file_size;
			}
		}

		return true;
	}